

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitArrayFill(PrintExpressionContents *this,ArrayFill *curr)

{
  HeapType type;
  string_view str;
  
  str._M_str = "array.fill ";
  str._M_len = 0xb;
  printMedium(this->o,str);
  type = wasm::Type::getHeapType(&curr->ref->type);
  printHeapTypeName(this,type);
  return;
}

Assistant:

void visitArrayFill(ArrayFill* curr) {
    printMedium(o, "array.fill ");
    printHeapTypeName(curr->ref->type.getHeapType());
  }